

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::LatchVisitor::check_stmt_block
               (StmtBlock *stmt,Var *var,
               vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *stmts,bool full_branch)

{
  bool bVar1;
  StmtException *this;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [30];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  const_iterator local_138;
  const_iterator local_130;
  v7 local_128 [32];
  string local_108;
  function<bool_(kratos::Stmt_*)> local_d8;
  undefined1 local_b8 [8];
  anon_class_16_2_b6e8bdf4 check;
  bool full_branch_local;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *stmts_local;
  Var *var_local;
  StmtBlock *stmt_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_b8 = (undefined1  [8])var;
  check.var._0_1_ = full_branch;
  check._15_1_ = full_branch;
  std::function<bool(kratos::Stmt*)>::
  function<kratos::LatchVisitor::check_stmt_block(kratos::StmtBlock*,kratos::Var*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>const&,bool)::_lambda(kratos::Stmt*)_1_&,void>
            ((function<bool(kratos::Stmt*)> *)&local_d8,(anon_class_16_2_b6e8bdf4 *)local_b8);
  args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(ulong)((byte)check._15_1_ & 1);
  bVar1 = check_stmt_condition(&stmt->super_Stmt,&local_d8,false,SUB41((byte)check._15_1_ & 1,0));
  std::function<bool_(kratos::Stmt_*)>::~function(&local_d8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(local_128);
  local_38 = &local_108;
  local_40 = "{0} will be inferred as latch";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_128;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[30],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0} will be inferred as latch",(v7 *)vargs,format_str,args);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&stmt_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str_00.size_ = (size_t)stmt_local;
  format_str_00.data_ = (char *)local_78.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)local_78.data_,format_str_00,args_00);
  local_130 = std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin(stmts);
  local_138 = std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end(stmts);
  StmtException::StmtException(this,&local_108,&local_130,&local_138);
  __cxa_throw(this,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

static void check_stmt_block(StmtBlock* stmt, Var* var, const std::vector<Stmt*>& stmts,
                                 bool full_branch) {
        auto check = [=](Stmt* s) -> bool {
            if (s->type() == StatementType::Assign) {
                auto* assign = reinterpret_cast<AssignStmt*>(s);
                auto* left = assign->left();
                if (left->type() == VarType::Slice) {
                    auto* slice = reinterpret_cast<VarSlice*>(left);
                    left = const_cast<Var*>(slice->get_var_root_parent());
                }
                return left == var;
            } else if (s->type() == StatementType::Block) {
                auto* block = reinterpret_cast<StmtBlock*>(s);
                if (block->block_type() == StatementBlockType::Function) {
                    // function call to set the variable
                    return check_stmt_block(block, var, full_branch);
                }
            }
            return false;
        };
        if (!check_stmt_condition(stmt, check, false, full_branch)) {
            // things goes wrong
            // need to recover all the statements
            throw StmtException(::format("{0} will be inferred as latch", var->to_string()),
                                stmts.begin(), stmts.end());
        }
    }